

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O3

MYSQL_ROW one_fquery_row(char *query)

{
  MYSQL *pMVar1;
  undefined8 uVar2;
  MYSQL_ROW ppcVar3;
  
  pMVar1 = open_fconn();
  mysql_query(pMVar1,query);
  uVar2 = mysql_store_result(pMVar1);
  ppcVar3 = (MYSQL_ROW)mysql_fetch_row(uVar2);
  mysql_free_result(uVar2);
  mysql_close(pMVar1);
  return ppcVar3;
}

Assistant:

MYSQL_ROW one_fquery_row(char *query)
{
	MYSQL *conn;
	MYSQL_RES *res_set;
	MYSQL_ROW row;

	conn = open_fconn();

	mysql_query(conn, query);
	res_set = mysql_store_result(conn);
	row = mysql_fetch_row(res_set);

	mysql_free_result(res_set);

	mysql_close(conn);
	return row;
}